

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridSequence::cacheBasisIntegrals
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridSequence *this)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint m;
  ulong uVar9;
  double v;
  double dVar10;
  vector<double,_std::allocator<double>_> lag_w;
  vector<double,_std::allocator<double>_> lag_x;
  
  puVar4 = (uint *)(this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  uVar6 = *puVar4;
  for (; puVar4 != (uint *)(this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    if ((int)uVar6 <= (int)*puVar4) {
      uVar6 = *puVar4;
    }
  }
  lag_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
             (long)(int)(uVar6 + 1),(value_type_conflict2 *)&lag_x,(allocator_type *)&lag_w);
  m = (int)(uVar6 + 1) / 2 + 1;
  lag_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  lag_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lag_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lag_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  lag_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lag_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  OneDimensionalNodes::getGaussLegendre
            (m,(vector<double,_std::allocator<double>_> *)&lag_w,
             (vector<double,_std::allocator<double>_> *)&lag_x);
  uVar5 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar5;
  }
  uVar9 = (ulong)m;
  if ((int)m < 1) {
    uVar9 = uVar5;
  }
  for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
    pdVar1 = (this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = 1.0;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      dVar10 = dVar10 * (lag_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar5] - pdVar1[uVar8]);
      pdVar3[uVar8 + 1] =
           (lag_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] * dVar10) / pdVar2[uVar8 + 1] +
           pdVar3[uVar8 + 1];
    }
  }
  *(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
   super__Vector_impl_data._M_start = 2.0;
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&lag_w);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&lag_x);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> GridSequence::cacheBasisIntegrals() const{
    int max_level = max_levels[0];

    for(auto l: max_levels) if (max_level < l) max_level = l;

    std::vector<double> integ(++max_level, 0.0); // integrals of basis functions

    int n = 1 + max_level / 2; // number of Gauss-Legendre points needed to integrate the basis functions
    std::vector<double> lag_x, lag_w;
    OneDimensionalNodes::getGaussLegendre(n, lag_w, lag_x);

    for(int i=0; i<n; i++){
        double v = 1.0;
        for(int j=1; j<max_level; j++){
            v *= (lag_x[i] - nodes[j-1]);
            integ[j] += lag_w[i] * v / coeff[j];
        }
    }
    integ[0] = 2.0;
    return integ;
}